

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O2

string * __thiscall
benchmark::GetBigOString_abi_cxx11_(string *__return_storage_ptr__,benchmark *this,BigO complexity)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = "(1)";
    paVar1 = &local_e;
    break;
  case 2:
    pcVar2 = "N";
    paVar1 = &local_9;
    break;
  case 3:
    pcVar2 = "N^2";
    paVar1 = &local_a;
    break;
  case 4:
    pcVar2 = "N^3";
    paVar1 = &local_b;
    break;
  case 5:
    pcVar2 = "lgN";
    paVar1 = &local_c;
    break;
  case 6:
    pcVar2 = "NlgN";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "f(N)";
    paVar1 = &local_f;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBigOString(BigO complexity) {
  switch (complexity) {
    case oN:
      return "N";
    case oNSquared:
      return "N^2";
    case oNCubed:
      return "N^3";
    case oLogN:
      return "lgN";
    case oNLogN:
      return "NlgN";
    case o1:
      return "(1)";
    default:
      return "f(N)";
  }
}